

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O2

thread * __thiscall jessilib::thread_pool::inactive_thread(thread_pool *this)

{
  _Elt_pointer pptVar1;
  thread *ptVar2;
  
  std::mutex::lock(&this->m_inactive_threads_mutex);
  pptVar1 = (this->m_inactive_threads).c.
            super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->m_inactive_threads).c.
      super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == pptVar1) {
    ptVar2 = (thread *)0x0;
  }
  else {
    ptVar2 = *pptVar1;
    std::deque<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>::
    pop_front(&(this->m_inactive_threads).c);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_inactive_threads_mutex);
  return ptVar2;
}

Assistant:

thread_pool::thread* thread_pool::inactive_thread() {
	std::lock_guard<std::mutex> guard(m_inactive_threads_mutex);

	if (!m_inactive_threads.empty()) {
		thread* result = m_inactive_threads.front();
		m_inactive_threads.pop();
		return result;
	}

	return nullptr;
}